

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ir.c
# Opt level: O0

void lj_ir_growtop(jit_State *J)

{
  uint uVar1;
  IRIns *pIVar2;
  void *pvStack_18;
  MSize szins;
  IRIns *baseir;
  jit_State *J_local;
  
  uVar1 = J->irtoplim - J->irbotlim;
  if (uVar1 == 0) {
    pvStack_18 = lj_mem_realloc(J->L,(void *)0x0,0,0x100);
    J->irbotlim = 0x7ff8;
    J->irtoplim = J->irbotlim + 0x20;
  }
  else {
    pvStack_18 = lj_mem_realloc(J->L,J->irbuf + J->irbotlim,(ulong)uVar1 << 3,
                                (ulong)(uVar1 * 2) << 3);
    J->irtoplim = J->irbotlim + uVar1 * 2;
  }
  pIVar2 = (IRIns *)((long)pvStack_18 + (ulong)J->irbotlim * -8);
  J->irbuf = pIVar2;
  (J->cur).ir = pIVar2;
  return;
}

Assistant:

void LJ_FASTCALL lj_ir_growtop(jit_State *J)
{
  IRIns *baseir = J->irbuf + J->irbotlim;
  MSize szins = J->irtoplim - J->irbotlim;
  if (szins) {
    baseir = (IRIns *)lj_mem_realloc(J->L, baseir, szins*sizeof(IRIns),
				     2*szins*sizeof(IRIns));
    J->irtoplim = J->irbotlim + 2*szins;
  } else {
    baseir = (IRIns *)lj_mem_realloc(J->L, NULL, 0, LJ_MIN_IRSZ*sizeof(IRIns));
    J->irbotlim = REF_BASE - LJ_MIN_IRSZ/4;
    J->irtoplim = J->irbotlim + LJ_MIN_IRSZ;
  }
  J->cur.ir = J->irbuf = baseir - J->irbotlim;
}